

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceOfCinematography.h
# Opt level: O0

void __thiscall
PieceOfCinematography::edit(PieceOfCinematography *this,int optionNumber,bool *endOfEditing)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  CustomException *pCVar4;
  istream *piVar5;
  CustomException *e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genres;
  string newGenre;
  allocator local_149;
  string local_148 [32];
  int local_128;
  undefined1 local_122;
  allocator local_121;
  int newDuration;
  int local_fc;
  string local_f8 [4];
  int newYearOfProduction;
  allocator local_d1;
  string local_d0 [8];
  string newTitle;
  allocator local_a9;
  string local_a8 [32];
  int local_88;
  undefined1 local_82;
  allocator local_81;
  int newNumberOfVotes;
  double local_60;
  double newRating;
  allocator local_41;
  string local_40 [8];
  string inputValue;
  bool *endOfEditing_local;
  int optionNumber_local;
  PieceOfCinematography *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (optionNumber == 1) {
    local_60 = 0.0;
    poVar2 = std::operator<<((ostream *)&std::cout,"set new rating:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_40);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_60 = atof(pcVar3);
    if ((10.0 < local_60) || (local_60 < 0.0)) {
      local_82 = 1;
      pCVar4 = (CustomException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&newNumberOfVotes,"wrong rating",&local_81);
      CustomException::CustomException(pCVar4,(string *)&newNumberOfVotes);
      local_82 = 0;
      __cxa_throw(pCVar4,&CustomException::typeinfo,CustomException::~CustomException);
    }
    setRating(this,local_60);
  }
  else if (optionNumber == 2) {
    local_88 = 0;
    poVar2 = std::operator<<((ostream *)&std::cout,"set new number of votes:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_40);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_88 = atoi(pcVar3);
    if (local_88 < 0) {
      pCVar4 = (CustomException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Number of votes can not be lower than 0",&local_a9);
      CustomException::CustomException(pCVar4,(string *)local_a8);
      __cxa_throw(pCVar4,&CustomException::typeinfo,CustomException::~CustomException);
    }
    setNumberOfVotes(this,local_88);
  }
  else if (optionNumber == 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    poVar2 = std::operator<<((ostream *)&std::cout,"set new title:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_d0);
    std::__cxx11::string::string(local_f8,local_d0);
    setTitle(this,(string *)local_f8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_d0);
  }
  else if (optionNumber == 4) {
    local_fc = 0;
    poVar2 = std::operator<<((ostream *)&std::cout,"set new year of production:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_40);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_fc = atoi(pcVar3);
    if (local_fc < 0) {
      local_122 = 1;
      pCVar4 = (CustomException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&newDuration,"Year of production can not be lower than 0",&local_121);
      CustomException::CustomException(pCVar4,(string *)&newDuration);
      local_122 = 0;
      __cxa_throw(pCVar4,&CustomException::typeinfo,CustomException::~CustomException);
    }
    setYearProduced(this,local_fc);
  }
  else if (optionNumber == 5) {
    local_128 = 0;
    poVar2 = std::operator<<((ostream *)&std::cout,"set new duration:");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator>>((istream *)&std::cin,local_40);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    local_128 = atoi(pcVar3);
    if (local_128 < 0) {
      pCVar4 = (CustomException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,"Duration can not be lower than 0",&local_149);
      CustomException::CustomException(pCVar4,(string *)local_148);
      __cxa_throw(pCVar4,&CustomException::typeinfo,CustomException::~CustomException);
    }
    setDuration(this,local_128);
  }
  else if (optionNumber == 6) {
    std::__cxx11::string::string
              ((string *)
               &genres.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&e);
    poVar2 = std::operator<<((ostream *)&std::cout,"set the genres of the piece of cinematography:")
    ;
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"To set each genre type it and then press enter."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "To finish setting the genres type \"apply\" and press enter.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    while( true ) {
      piVar5 = std::operator>>((istream *)&std::cin,
                               (string *)
                               &genres.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
      if ((!bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&genres.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"apply"),
         bVar1)) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&e,(value_type *)
                        &genres.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    setGenres(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&e);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&e);
    std::__cxx11::string::~string
              ((string *)
               &genres.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else if (optionNumber == 7) {
    *endOfEditing = true;
  }
  else if ((optionNumber == 0) || (this->numberOfOptions < optionNumber)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"wrong number");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

virtual void edit(int optionNumber, bool &endOfEditing) {
        try {
            string inputValue="";
            if (optionNumber == 1) {
                double newRating = 0;
                cout << "set new rating:" << endl;
                cin >> inputValue;
                newRating = atof(inputValue.c_str());
                if(newRating>10 || newRating<0) throw CustomException("wrong rating");
                setRating(newRating);
            } else if (optionNumber == 2) {
                int newNumberOfVotes = 0;
                cout << "set new number of votes:" << endl;
                cin >> inputValue;
                newNumberOfVotes = atoi(inputValue.c_str());
                if(newNumberOfVotes<0) throw CustomException("Number of votes can not be lower than 0");
                setNumberOfVotes(newNumberOfVotes);
            } else if (optionNumber == 3) {
                string newTitle = "";
                cout << "set new title:" << endl;
                cin >> newTitle;
                setTitle(newTitle);
            } else if (optionNumber == 4) {
                int newYearOfProduction = 0;
                cout << "set new year of production:" << endl;
                cin >> inputValue;
                newYearOfProduction=atoi(inputValue.c_str());
                if(newYearOfProduction<0) throw CustomException("Year of production can not be lower than 0");
                setYearProduced(newYearOfProduction);
            } else if (optionNumber == 5) {
                int newDuration = 0;
                cout << "set new duration:" << endl;
                cin >> inputValue;
                newDuration=atoi(inputValue.c_str());
                if(newDuration<0) throw CustomException("Duration can not be lower than 0");
                setDuration(newDuration);
            } else if (optionNumber == 6) {
                string newGenre;
                vector<string> genres;
                cout << "set the genres of the piece of cinematography:" << endl;
                cout << "To set each genre type it and then press enter." << endl;
                cout << "To finish setting the genres type \"apply\" and press enter." << endl;
                while (cin >> newGenre) {
                    if (newGenre == "apply") break;
                    genres.push_back(newGenre);
                }
                setGenres(genres);
            } else if (optionNumber == 7) {
                endOfEditing = true;
            } else {
                if (optionNumber == 0 || optionNumber > numberOfOptions) {
                    cout << "wrong number" << endl;
                }
            }
        } catch(CustomException &e){
            cout<<e.getMessage()<<endl;
        }
    }